

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::animateHiddingBlurEffect(AbstractScrollAreaPrivate *this)

{
  QVariantAnimation *pQVar1;
  QVariant QStack_38;
  
  pQVar1 = this->horBlurAnim;
  QVariant::QVariant(&QStack_38,this->horBlur->pressure);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&QStack_38);
  pQVar1 = this->horBlurAnim;
  QVariant::QVariant(&QStack_38,0);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&QStack_38);
  pQVar1 = this->vertBlurAnim;
  QVariant::QVariant(&QStack_38,this->vertBlur->pressure);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&QStack_38);
  pQVar1 = this->vertBlurAnim;
  QVariant::QVariant(&QStack_38,0);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&QStack_38);
  if (this->horBlur->pressure != 0) {
    QAbstractAnimation::start(this->horBlurAnim,0);
  }
  if (this->vertBlur->pressure != 0) {
    QAbstractAnimation::start(this->vertBlurAnim,0);
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::animateHiddingBlurEffect()
{
	horBlurAnim->setStartValue( horBlur->pressure );
	horBlurAnim->setEndValue( 0 );
	vertBlurAnim->setStartValue( vertBlur->pressure );
	vertBlurAnim->setEndValue( 0 );

	if( horBlur->pressure != 0 )
		horBlurAnim->start();

	if( vertBlur->pressure != 0 )
		vertBlurAnim->start();
}